

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_01;
  undefined1 auStack_1e8 [16];
  string ll;
  string local_1b8;
  string flagVar;
  
  TVar3 = GetType(this);
  if ((((TVar3 != EXECUTABLE) && (TVar3 = GetType(this), TVar3 != SHARED_LIBRARY)) &&
      (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) ||
     (bVar1 = cmTarget::GetHaveInstallRule(this->Target), !bVar1)) {
    return false;
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flagVar,"CMAKE_SKIP_RPATH",(allocator<char> *)&ll);
  bVar1 = cmMakefile::IsOn(this_00,&flagVar);
  std::__cxx11::string::~string((string *)&flagVar);
  if (bVar1) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flagVar,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&ll);
  bVar1 = GetPropertyAsBool(this,&flagVar);
  std::__cxx11::string::~string((string *)&flagVar);
  if (bVar1) {
    return false;
  }
  bVar1 = IsChrpathUsed(this,config);
  if (bVar1) {
    return false;
  }
  GetLinkerLanguage(&ll,this,config);
  if (ll._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flagVar,"CMAKE_SHARED_LIBRARY_RUNTIME_",(allocator<char> *)&local_1b8);
    std::__cxx11::string::append((string *)&flagVar);
    std::__cxx11::string::append((char *)&flagVar);
    bVar1 = cmMakefile::IsSet(this->Makefile,&flagVar);
    std::__cxx11::string::~string((string *)&flagVar);
    if (bVar1) {
      bVar1 = HaveBuildTreeRPATH(this,config);
      bVar2 = true;
      if (!bVar1) {
        bVar2 = HaveInstallTreeRPATH(this,config);
      }
      (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&flagVar);
      bVar1 = std::operator==(&flagVar,"Ninja");
      std::__cxx11::string::~string((string *)&flagVar);
      if ((bVar1 & bVar2) == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&flagVar);
        poVar4 = std::operator<<((ostream *)&flagVar,"The install of the ");
        psVar5 = GetName_abi_cxx11_(this);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        std::operator<<(poVar4,
                        " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                       );
        this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace((cmGeneratorTarget *)auStack_1e8);
        cmake::IssueMessage(this_01,FATAL_ERROR,&local_1b8,(cmListFileBacktrace *)auStack_1e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1e8 + 8));
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&flagVar);
        bVar2 = true;
      }
      goto LAB_002b1992;
    }
  }
  bVar2 = false;
LAB_002b1992:
  std::__cxx11::string::~string((string *)&ll);
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::NeedRelinkBeforeInstall(
  const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if (this->GetType() != cmStateEnums::EXECUTABLE &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY) {
    return false;
  }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // If skipping all rpaths completely then no relinking is needed.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // If building with the install-tree rpath no relinking is needed.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // If chrpath is going to be used no relinking is needed.
  if (this->IsChrpathUsed(config)) {
    return false;
  }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string flagVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    flagVar += ll;
    flagVar += "_FLAG";
    if (!this->Makefile->IsSet(flagVar)) {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
    }
  } else {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
  }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  bool have_rpath =
    this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH(config);
  bool is_ninja =
    this->LocalGenerator->GetGlobalGenerator()->GetName() == "Ninja";

  if (have_rpath && is_ninja) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The install of the " << this->GetName() << " target requires "
      "changing an RPATH from the build tree, but this is not supported "
      "with the Ninja generator unless on an ELF-based platform.  The "
      "CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this "
      "relinking step."
      ;
    /* clang-format on */

    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return have_rpath;
}